

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O1

void Dtt_DumpLibrary(Dtt_Man_t *p,char *FileName)

{
  uint uVar1;
  int iVar2;
  uint tFun;
  uint tNpn;
  uint tFun_00;
  int *piVar3;
  long lVar4;
  uint *puVar5;
  int iVar6;
  int *piVar7;
  void *__dest;
  Vec_Vec_t *vLibImpl;
  void **ppvVar8;
  undefined8 *puVar9;
  Vec_Int_t *pVVar10;
  uint *pType;
  void **ppvVar11;
  void *pvVar12;
  FILE *__stream;
  uint uVar13;
  uint uVar14;
  size_t sVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  int iVar23;
  size_t __nmemb;
  char str [100];
  uint local_98 [26];
  
  pVVar10 = p->vTruthNpns;
  piVar7 = (int *)malloc(0x10);
  iVar6 = pVVar10->nSize;
  __nmemb = (size_t)iVar6;
  piVar7[1] = iVar6;
  *piVar7 = iVar6;
  if (__nmemb == 0) {
    __dest = (void *)0x0;
  }
  else {
    __dest = malloc(__nmemb * 4);
  }
  *(void **)(piVar7 + 2) = __dest;
  memcpy(__dest,pVVar10->pArray,__nmemb * 4);
  if (1 < iVar6) {
    qsort(__dest,__nmemb,4,Vec_IntSortCompare1);
    iVar6 = 1;
    sVar15 = 1;
    do {
      iVar23 = *(int *)((long)__dest + sVar15 * 4);
      if (iVar23 != *(int *)((long)__dest + sVar15 * 4 + -4)) {
        lVar19 = (long)iVar6;
        iVar6 = iVar6 + 1;
        *(int *)((long)__dest + lVar19 * 4) = iVar23;
      }
      sVar15 = sVar15 + 1;
    } while (__nmemb != sVar15);
    piVar7[1] = iVar6;
  }
  uVar1 = piVar7[1];
  uVar22 = (ulong)uVar1;
  vLibImpl = (Vec_Vec_t *)malloc(0x10);
  uVar13 = 8;
  if (6 < uVar1 - 1) {
    uVar13 = uVar1;
  }
  vLibImpl->nSize = 0;
  vLibImpl->nCap = uVar13;
  if (uVar13 == 0) {
    ppvVar8 = (void **)0x0;
  }
  else {
    ppvVar8 = (void **)malloc((long)(int)uVar13 << 3);
  }
  vLibImpl->pArray = ppvVar8;
  if (0 < (int)uVar1) {
    uVar17 = 0;
    do {
      puVar9 = (undefined8 *)malloc(0x10);
      *puVar9 = 0;
      puVar9[1] = 0;
      ppvVar8[uVar17] = puVar9;
      uVar17 = uVar17 + 1;
    } while (uVar22 != uVar17);
  }
  vLibImpl->nSize = uVar1;
  pVVar10 = p->vTruths;
  uVar17 = (ulong)(uint)pVVar10->nSize;
  if (pVVar10->nSize < 1) {
LAB_0051761c:
    __stream = fopen(FileName,"wb");
    if (0 < (int)uVar1) {
      uVar17 = 0;
      do {
        if (1 < uVar17) {
          iVar6 = vLibImpl->nSize;
          if ((long)iVar6 <= (long)uVar17) {
LAB_005176bb:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                          ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
          }
          uVar1 = *(uint *)((long)__dest + uVar17 * 4);
          ppvVar8 = vLibImpl->pArray;
          lVar19 = 0;
          while (lVar19 < *(int *)((long)ppvVar8[uVar17] + 4)) {
            local_98[0] = local_98[0] & 0xffffff00;
            Dtt_MakeFormula(uVar1,*(Dtt_FunImpl_t **)
                                   (*(long *)((long)ppvVar8[uVar17] + 8) + lVar19 * 8),vLibImpl,
                            0x43210,(char *)local_98,1,(FILE *)__stream);
            lVar19 = lVar19 + 1;
            if ((long)iVar6 <= (long)uVar17) goto LAB_005176bb;
          }
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 != uVar22);
    }
    fclose(__stream);
    printf("Dumped file \"%s\". \n",FileName);
    fflush(_stdout);
    return;
  }
  uVar18 = 0;
LAB_00517225:
  if (1 < uVar18) {
    piVar7 = pVVar10->pArray;
    uVar13 = piVar7[uVar18];
    pType = (uint *)calloc(1,0x14);
    if ((long)uVar18 < (long)p->vConfigs->nSize) {
      *pType = p->vConfigs->pArray[uVar18] & 7;
      lVar19 = uVar18 * 2 + 1;
      iVar6 = p->vFanins->nSize;
      if ((int)lVar19 < iVar6) {
        piVar3 = p->vFanins->pArray;
        iVar23 = piVar3[lVar19];
        lVar19 = (long)iVar23;
        if (((-1 < lVar19) && (iVar23 < (int)uVar17)) && ((int)uVar18 * 2 < iVar6)) {
          iVar6 = piVar3[uVar18 * 2];
          if (-1 < (long)iVar6) {
            iVar2 = p->vTruthNpns->nSize;
            if ((iVar6 < iVar2) && (iVar23 < iVar2)) {
              piVar3 = p->vTruthNpns->pArray;
              uVar21 = piVar3[iVar6];
              uVar14 = 0xffffffff;
              uVar17 = 0xffffffff;
              if (0 < (int)uVar1) {
                uVar17 = 0;
                do {
                  if (*(uint *)((long)__dest + uVar17 * 4) == uVar21) goto LAB_005172fe;
                  uVar17 = uVar17 + 1;
                } while (uVar22 != uVar17);
                uVar17 = 0xffffffff;
              }
LAB_005172fe:
              tFun = piVar7[lVar19];
              tNpn = piVar3[lVar19];
              uVar16 = (uint)uVar17;
              pType[2] = uVar16;
              if (0 < (int)uVar1) {
                uVar17 = 0;
                do {
                  if (*(uint *)((long)__dest + uVar17 * 4) == tNpn) {
                    uVar14 = (uint)uVar17;
                    break;
                  }
                  uVar17 = uVar17 + 1;
                } while (uVar22 != uVar17);
              }
              pType[4] = uVar14;
              if ((long)uVar18 < (long)iVar2) {
                tFun_00 = piVar3[uVar18];
                lVar19 = 0;
                do {
                  uVar20 = 0xffffffff;
                  if (0 < (int)uVar1) {
                    uVar17 = 0;
                    do {
                      if (*(uint *)((long)__dest + uVar17 * 4) == tFun_00) {
                        uVar20 = (uint)uVar17;
                        break;
                      }
                      uVar17 = uVar17 + 1;
                    } while (uVar22 != uVar17);
                  }
                  if ((int)uVar20 < 0) goto LAB_005176bb;
                  iVar6 = vLibImpl->nSize;
                  if (iVar6 <= (int)uVar20) goto LAB_005176bb;
                  if (*(int *)((long)ppvVar8[uVar20] + 4) <= lVar19) {
                    Dtt_FindNP(p,tFun_00,0,uVar13,(int *)local_98,(int *)pType,0);
                    uVar14 = local_98[0];
                    Dtt_FindNP(p,tFun,uVar13,uVar21,(int *)(pType + 1),(int *)pType,local_98[0]);
                    Dtt_FindNP(p,tFun,0,tNpn,(int *)(pType + 3),(int *)pType,uVar14);
                    if ((long)p->vTruthNpns->nSize <= (long)uVar18) break;
                    uVar13 = 0xffffffff;
                    if ((int)uVar1 < 1) goto LAB_005174cc;
                    uVar17 = 0;
                    goto LAB_005174ba;
                  }
                  uVar20 = 0xffffffff;
                  if (0 < (int)uVar1) {
                    uVar17 = 0;
                    do {
                      if (*(uint *)((long)__dest + uVar17 * 4) == tFun_00) {
                        uVar20 = (uint)uVar17;
                        break;
                      }
                      uVar17 = uVar17 + 1;
                    } while (uVar22 != uVar17);
                  }
                  if (((int)uVar20 < 0) || (iVar6 <= (int)uVar20)) goto LAB_005176bb;
                  if (*(int *)((long)ppvVar8[uVar20] + 4) <= lVar19) {
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                  }
                  lVar4 = *(long *)(*(long *)((long)ppvVar8[uVar20] + 8) + lVar19 * 8);
                  if (((*(uint *)(lVar4 + 8) == uVar16) && (*(uint *)(lVar4 + 0x10) == uVar14)) ||
                     (*(uint *)(lVar4 + 8) == uVar14 && *(uint *)(lVar4 + 0x10) == uVar16))
                  goto LAB_0051740a;
                  lVar19 = lVar19 + 1;
                  if ((long)iVar2 <= (long)uVar18) break;
                } while( true );
              }
            }
          }
        }
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  goto LAB_00517607;
  while (uVar17 = uVar17 + 1, uVar22 != uVar17) {
LAB_005174ba:
    if (*(int *)((long)__dest + uVar17 * 4) == p->vTruthNpns->pArray[uVar18]) {
      uVar13 = (uint)uVar17;
      break;
    }
  }
LAB_005174cc:
  if (iVar6 <= (int)uVar13) {
    iVar23 = uVar13 + 1;
    if (vLibImpl->nCap <= (int)uVar13) {
      if (vLibImpl->pArray == (void **)0x0) {
        ppvVar11 = (void **)malloc((long)iVar23 << 3);
      }
      else {
        ppvVar11 = (void **)realloc(vLibImpl->pArray,(long)iVar23 << 3);
      }
      vLibImpl->pArray = ppvVar11;
      vLibImpl->nCap = iVar23;
    }
    lVar19 = 0;
    do {
      puVar9 = (undefined8 *)malloc(0x10);
      *puVar9 = 0;
      puVar9[1] = 0;
      ppvVar8[iVar6 + lVar19] = puVar9;
      lVar19 = lVar19 + 1;
    } while ((uVar13 - iVar6) + 1 != (int)lVar19);
    vLibImpl->nSize = iVar23;
  }
  if (((int)uVar13 < 0) || (vLibImpl->nSize <= (int)uVar13)) goto LAB_005176bb;
  puVar5 = (uint *)ppvVar8[uVar13];
  uVar13 = *puVar5;
  if (puVar5[1] == uVar13) {
    if ((int)uVar13 < 0x10) {
      if (*(void **)(puVar5 + 2) == (void *)0x0) {
        pvVar12 = malloc(0x80);
      }
      else {
        pvVar12 = realloc(*(void **)(puVar5 + 2),0x80);
      }
      *(void **)(puVar5 + 2) = pvVar12;
      uVar21 = 0x10;
    }
    else {
      uVar21 = uVar13 * 2;
      if ((int)uVar21 <= (int)uVar13) goto LAB_005175ef;
      if (*(void **)(puVar5 + 2) == (void *)0x0) {
        pvVar12 = malloc((ulong)uVar13 << 4);
      }
      else {
        pvVar12 = realloc(*(void **)(puVar5 + 2),(ulong)uVar13 << 4);
      }
      *(void **)(puVar5 + 2) = pvVar12;
    }
    *puVar5 = uVar21;
  }
LAB_005175ef:
  uVar13 = puVar5[1];
  puVar5[1] = uVar13 + 1;
  *(uint **)(*(long *)(puVar5 + 2) + (long)(int)uVar13 * 8) = pType;
LAB_00517607:
  uVar18 = uVar18 + 1;
  pVVar10 = p->vTruths;
  uVar17 = (ulong)pVVar10->nSize;
  if ((long)uVar17 <= (long)uVar18) goto LAB_0051761c;
  goto LAB_00517225;
LAB_0051740a:
  free(pType);
  goto LAB_00517607;
}

Assistant:

void Dtt_DumpLibrary( Dtt_Man_t * p, char* FileName )
{
    FILE * pFile;
    char str[100], sFI1[50], sFI2[50];
    int i, j, Entry, fRepeat;
    Dtt_FunImpl_t * pFun, * pFun2;
    Vec_Int_t * vLibFun = Vec_IntDup( p->vTruthNpns );  // none-duplicating vector of NPN representitives
    Vec_Vec_t * vLibImpl;
    Vec_IntUniqify( vLibFun );
    vLibImpl = Vec_VecStart( Vec_IntSize( vLibFun ) );
    Vec_IntForEachEntry( p->vTruths, Entry, i )
    {
        int NP, Fanin2, Fanin1Npn, Fanin2Npn;
        if (i<2) continue; // skip const 0
        pFun = ABC_CALLOC( Dtt_FunImpl_t, 1 );
        pFun->Type = (int)( 0x7 & Vec_IntEntry(p->vConfigs, i) );
        //word Fanin1 = Vec_IntEntry( p->vTruths, Vec_IntEntry( p->vFanins, i*2 ) );
        Fanin2 = Vec_IntEntry( p->vTruths, Vec_IntEntry( p->vFanins, i*2+1 ) );
        Fanin1Npn = Vec_IntEntry( p->vTruthNpns, Vec_IntEntry( p->vFanins, i*2 ) );
        Fanin2Npn = Vec_IntEntry( p->vTruthNpns, Vec_IntEntry( p->vFanins, i*2+1 ) );
        pFun->FI1 = Vec_IntFind( vLibFun, Fanin1Npn );
        pFun->FI2 = Vec_IntFind( vLibFun, Fanin2Npn );
        
        fRepeat = 0;
        Vec_VecForEachEntryLevel( Dtt_FunImpl_t*, vLibImpl, pFun2, j, Vec_IntFind( vLibFun, Vec_IntEntry( p->vTruthNpns, i ) ) )
        {
            if ( ( pFun2->FI1 == pFun->FI1 && pFun2->FI2 == pFun->FI2 ) || ( pFun2->FI2 == pFun->FI1 && pFun2->FI1 == pFun->FI2 ) )
            {
                fRepeat = 1;
                break;
            }
        }
        if (fRepeat) 
        {
            ABC_FREE( pFun );
            continue;
        }

        Dtt_FindNP( p, Vec_IntEntry( p->vTruthNpns, i ), 0, Entry, &NP, &(pFun->Type), 0 ); //out: tGoal=0, NPout=0
        Dtt_FindNP( p, Fanin2, Entry, Fanin1Npn, &(pFun->NP1), &(pFun->Type), NP ); //FI1
        Dtt_FindNP( p, Fanin2, 0, Fanin2Npn, &(pFun->NP2), &(pFun->Type), NP ); //FI2: tGoal=0
        
        Vec_VecPush( vLibImpl, Vec_IntFind( vLibFun, Vec_IntEntry( p->vTruthNpns, i ) ), pFun );
    }

    // print to file
    pFile = fopen( FileName, "wb" );

    if (0)
    Vec_IntForEachEntry( vLibFun, Entry, i )
    {
        if (!Entry) continue; // skip const 0
        fprintf( pFile, "%08x: ", (unsigned)Entry );
        Vec_VecForEachEntryLevel( Dtt_FunImpl_t*, vLibImpl, pFun, j, i )
        {
            Dtt_FunImplFI2Str( pFun->FI1, pFun->NP1, vLibFun, sFI1 ); 
            Dtt_FunImplFI2Str( pFun->FI2, pFun->NP2, vLibFun, sFI2 );
            Dtt_FunImpl2Str( pFun->Type, sFI1, sFI2, str );
            fprintf( pFile, "%s, ", str );
        }
        fprintf( pFile, "\n" );
    }

    // formula format
    Vec_IntForEachEntry( vLibFun, Entry, i )
    {
        if ( i<2 ) continue; // skip const 0 and buffer
        Vec_VecForEachEntryLevel( Dtt_FunImpl_t*, vLibImpl, pFun, j, i )
        {
            str[0] = 0; //sprintf( str, "" );
            Dtt_MakeFormula( (unsigned)Entry, pFun, vLibImpl, (4<<16)+(3<<12)+(2<<8)+(1<<4), str, 1, pFile );
        }
    }

    fclose( pFile );
    printf( "Dumped file \"%s\". \n", FileName );
    fflush( stdout );
}